

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O2

void sx__coro_remove_list(sx__coro_state **pfirst,sx__coro_state **plast,sx__coro_state *node)

{
  sx__coro_state *psVar1;
  sx__coro_state *psVar2;
  
  psVar1 = node->next;
  psVar2 = node->prev;
  if (psVar2 != (sx__coro_state *)0x0) {
    psVar2->next = psVar1;
  }
  if (psVar1 != (sx__coro_state *)0x0) {
    psVar1->prev = psVar2;
  }
  if (*pfirst == node) {
    *pfirst = psVar1;
  }
  if (*plast == node) {
    *plast = node->prev;
  }
  node->next = (sx__coro_state *)0x0;
  node->prev = (sx__coro_state *)0x0;
  return;
}

Assistant:

static inline void sx__coro_remove_list(sx__coro_state** pfirst, sx__coro_state** plast,
                                        sx__coro_state* node)
{
    if (node->prev)
        node->prev->next = node->next;
    if (node->next)
        node->next->prev = node->prev;
    if (*pfirst == node)
        *pfirst = node->next;
    if (*plast == node)
        *plast = node->prev;
    node->prev = node->next = NULL;
}